

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall TApp_RequiredSubCom_Test::TestBody(TApp_RequiredSubCom_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  iterator local_f8;
  size_type local_f0;
  AssertHelper local_e8;
  Message local_e0 [2];
  RequiredError *anon_var_0;
  char *pcStack_c8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  TApp_RequiredSubCom_Test *local_10;
  TApp_RequiredSubCom_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"sub1",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  CLI::App::add_subcommand(&(this->super_TApp).app,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"sub2",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"",(allocator *)((long)&gtest_msg.value + 7));
  CLI::App::add_subcommand(&(this->super_TApp).app,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  CLI::App::require_subcommand(&(this->super_TApp).app);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff38,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff38);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0011f77f;
    pcStack_c8 = 
    "Expected: run() throws an exception of type CLI::RequiredError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_e0);
  testing::internal::AssertHelper::AssertHelper
            (&local_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x14c,pcStack_c8);
  testing::internal::AssertHelper::operator=(&local_e8,local_e0);
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  testing::Message::~Message(local_e0);
LAB_0011f77f:
  CLI::App::reset(&(this->super_TApp).app);
  local_120 = &local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"sub1",&local_121);
  local_f8 = &local_118;
  local_f0 = 1;
  __l._M_len = 1;
  __l._M_array = local_f8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8;
  do {
    local_180 = local_180 + -1;
    std::__cxx11::string::~string((string *)local_180);
  } while (local_180 != &local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RequiredSubCom) {
    app.add_subcommand("sub1");
    app.add_subcommand("sub2");

    app.require_subcommand();

    EXPECT_THROW(run(), CLI::RequiredError);

    app.reset();

    args = {"sub1"};

    run();
}